

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::MergeFrom
          (ItemSimilarityRecommender *this,ItemSimilarityRecommender *from)

{
  void *pvVar1;
  string *psVar2;
  string *psVar3;
  LogMessage *other;
  StringVector *this_00;
  Int64Vector *this_01;
  StringVector *from_00;
  Int64Vector *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/ItemSimilarityRecommender.pb.cc"
               ,0x456);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::TypeHandler>
            (&(this->itemitemsimilarities_).super_RepeatedPtrFieldBase,
             &(from->itemitemsimilarities_).super_RepeatedPtrFieldBase);
  psVar2 = (from->iteminputfeaturename_).ptr_;
  if ((psVar2->_M_string_length != 0) &&
     (psVar3 = (this->iteminputfeaturename_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->iteminputfeaturename_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  psVar2 = (from->numrecommendationsinputfeaturename_).ptr_;
  if ((psVar2->_M_string_length != 0) &&
     (psVar3 = (this->numrecommendationsinputfeaturename_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->numrecommendationsinputfeaturename_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  psVar2 = (from->itemrestrictioninputfeaturename_).ptr_;
  if ((psVar2->_M_string_length != 0) &&
     (psVar3 = (this->itemrestrictioninputfeaturename_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->itemrestrictioninputfeaturename_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  psVar2 = (from->itemexclusioninputfeaturename_).ptr_;
  if ((psVar2->_M_string_length != 0) &&
     (psVar3 = (this->itemexclusioninputfeaturename_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->itemexclusioninputfeaturename_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  psVar2 = (from->recommendeditemlistoutputfeaturename_).ptr_;
  if ((psVar2->_M_string_length != 0) &&
     (psVar3 = (this->recommendeditemlistoutputfeaturename_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->recommendeditemlistoutputfeaturename_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  psVar2 = (from->recommendeditemscoreoutputfeaturename_).ptr_;
  if ((psVar2->_M_string_length != 0) &&
     (psVar3 = (this->recommendeditemscoreoutputfeaturename_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->recommendeditemscoreoutputfeaturename_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  from_00 = from->itemstringids_;
  if (from_00 != (StringVector *)0x0 &&
      from != (ItemSimilarityRecommender *)&_ItemSimilarityRecommender_default_instance_) {
    this_00 = this->itemstringids_;
    if (this_00 == (StringVector *)0x0) {
      this_00 = (StringVector *)operator_new(0x30);
      StringVector::StringVector(this_00);
      this->itemstringids_ = this_00;
      from_00 = from->itemstringids_;
    }
    if (from_00 == (StringVector *)0x0) {
      from_00 = (StringVector *)&_StringVector_default_instance_;
    }
    StringVector::MergeFrom(this_00,from_00);
  }
  from_01 = from->itemint64ids_;
  if (from_01 != (Int64Vector *)0x0 &&
      from != (ItemSimilarityRecommender *)&_ItemSimilarityRecommender_default_instance_) {
    this_01 = this->itemint64ids_;
    if (this_01 == (Int64Vector *)0x0) {
      this_01 = (Int64Vector *)operator_new(0x28);
      Int64Vector::Int64Vector(this_01);
      this->itemint64ids_ = this_01;
      from_01 = from->itemint64ids_;
    }
    if (from_01 == (Int64Vector *)0x0) {
      from_01 = (Int64Vector *)&_Int64Vector_default_instance_;
    }
    Int64Vector::MergeFrom(this_01,from_01);
  }
  return;
}

Assistant:

void ItemSimilarityRecommender::MergeFrom(const ItemSimilarityRecommender& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ItemSimilarityRecommender)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  itemitemsimilarities_.MergeFrom(from.itemitemsimilarities_);
  if (from.iteminputfeaturename().size() > 0) {

    iteminputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.iteminputfeaturename_);
  }
  if (from.numrecommendationsinputfeaturename().size() > 0) {

    numrecommendationsinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.numrecommendationsinputfeaturename_);
  }
  if (from.itemrestrictioninputfeaturename().size() > 0) {

    itemrestrictioninputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.itemrestrictioninputfeaturename_);
  }
  if (from.itemexclusioninputfeaturename().size() > 0) {

    itemexclusioninputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.itemexclusioninputfeaturename_);
  }
  if (from.recommendeditemlistoutputfeaturename().size() > 0) {

    recommendeditemlistoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.recommendeditemlistoutputfeaturename_);
  }
  if (from.recommendeditemscoreoutputfeaturename().size() > 0) {

    recommendeditemscoreoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.recommendeditemscoreoutputfeaturename_);
  }
  if (from.has_itemstringids()) {
    mutable_itemstringids()->::CoreML::Specification::StringVector::MergeFrom(from.itemstringids());
  }
  if (from.has_itemint64ids()) {
    mutable_itemint64ids()->::CoreML::Specification::Int64Vector::MergeFrom(from.itemint64ids());
  }
}